

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)> * __thiscall
testing::internal::
FunctionMocker<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)>::With
          (MockSpec<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)>
           *__return_storage_ptr__,
          FunctionMocker<void_(const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&)> *this,
          Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *m)

{
  MatcherBase<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> local_20;
  
  local_20.vtable_ =
       (m->super_MatcherBase<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>).vtable_;
  local_20.buffer_ =
       (m->super_MatcherBase<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>).buffer_;
  (m->super_MatcherBase<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>).vtable_ =
       (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002fdff0;
  __return_storage_ptr__->function_mocker_ = this;
  Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>::Matcher
            ((Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *)
             &__return_storage_ptr__->matchers_,
             (Matcher<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *)&local_20);
  MatcherBase<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }